

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twopass_encoder.c
# Opt level: O0

int encode_frame(aom_codec_ctx_t *ctx,aom_image_t *img,aom_codec_pts_t pts,uint duration,
                aom_enc_frame_flags_t flags,AvxVideoWriter *writer)

{
  aom_codec_err_t aVar1;
  uint uVar2;
  int iVar3;
  aom_codec_cx_pkt_t *writer_00;
  undefined4 in_ECX;
  aom_image_t *in_R8;
  aom_codec_ctx_t *in_R9;
  int keyframe;
  aom_codec_err_t res;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t iter;
  int got_pkts;
  size_t in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  char *pcVar5;
  aom_codec_ctx_t *ctx_00;
  uint in_stack_ffffffffffffffc8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar6 = 0;
  ctx_00 = (aom_codec_ctx_t *)0x0;
  pcVar5 = (char *)0x0;
  aVar1 = aom_codec_encode((aom_codec_ctx_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
                           (aom_codec_pts_t)in_R9,(ulong)in_stack_ffffffffffffffc8,0);
  if (aVar1 != AOM_CODEC_OK) {
    die_codec(ctx_00,pcVar5);
  }
  uVar4 = 0;
  while( true ) {
    do {
      writer_00 = aom_codec_get_cx_data
                            (in_R9,(aom_codec_iter_t *)CONCAT44(iVar6,in_stack_ffffffffffffffc8));
      if (writer_00 == (aom_codec_cx_pkt_t *)0x0) {
        return iVar6;
      }
      iVar6 = 1;
    } while (writer_00->kind != AOM_CODEC_CX_FRAME_PKT);
    uVar2 = (uint)(((writer_00->data).frame.flags & 1) != 0);
    iVar3 = aom_video_writer_write_frame
                      ((AvxVideoWriter *)writer_00,(uint8_t *)CONCAT44(uVar4,uVar2),
                       in_stack_ffffffffffffffa8,0x11945b);
    if (iVar3 == 0) break;
    pcVar5 = ".";
    if (uVar2 != 0) {
      pcVar5 = "K";
    }
    printf(pcVar5);
    fflush(_stdout);
  }
  die_codec(ctx_00,(char *)writer_00);
}

Assistant:

static int encode_frame(aom_codec_ctx_t *ctx, const aom_image_t *img,
                        aom_codec_pts_t pts, unsigned int duration,
                        aom_enc_frame_flags_t flags, AvxVideoWriter *writer) {
  int got_pkts = 0;
  aom_codec_iter_t iter = NULL;
  const aom_codec_cx_pkt_t *pkt = NULL;
  const aom_codec_err_t res = aom_codec_encode(ctx, img, pts, duration, flags);
  if (res != AOM_CODEC_OK) die_codec(ctx, "Failed to encode frame.");

  while ((pkt = aom_codec_get_cx_data(ctx, &iter)) != NULL) {
    got_pkts = 1;
    if (pkt->kind == AOM_CODEC_CX_FRAME_PKT) {
      const int keyframe = (pkt->data.frame.flags & AOM_FRAME_IS_KEY) != 0;

      if (!aom_video_writer_write_frame(writer, pkt->data.frame.buf,
                                        pkt->data.frame.sz,
                                        pkt->data.frame.pts))
        die_codec(ctx, "Failed to write compressed frame.");
      printf(keyframe ? "K" : ".");
      fflush(stdout);
    }
  }

  return got_pkts;
}